

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_direct.c
# Opt level: O0

void SetToZero(DlsMat A)

{
  long lVar1;
  long lVar2;
  realtype *prVar3;
  long lVar4;
  long lVar5;
  realtype *col_j;
  sunindextype colSize;
  sunindextype j;
  sunindextype i;
  DlsMat A_local;
  
  if (A->type == 1) {
    for (colSize = 0; colSize < A->N; colSize = colSize + 1) {
      prVar3 = A->cols[colSize];
      for (j = 0; j < A->M; j = j + 1) {
        prVar3[j] = 0.0;
      }
    }
  }
  else if (A->type == 2) {
    lVar1 = A->mu;
    lVar2 = A->ml;
    for (colSize = 0; colSize < A->M; colSize = colSize + 1) {
      prVar3 = A->cols[colSize];
      lVar4 = A->s_mu;
      lVar5 = A->mu;
      for (j = 0; j < lVar1 + lVar2 + 1; j = j + 1) {
        prVar3[lVar4 + (j - lVar5)] = 0.0;
      }
    }
  }
  return;
}

Assistant:

void SetToZero(DlsMat A)
{
  sunindextype i, j, colSize;
  realtype *col_j;

  switch (A->type) {

  case SUNDIALS_DENSE:
    
    for (j=0; j<A->N; j++) {
      col_j = A->cols[j];
      for (i=0; i<A->M; i++)
        col_j[i] = ZERO;
    }

    break;

  case SUNDIALS_BAND:

    colSize = A->mu + A->ml + 1;
    for (j=0; j<A->M; j++) {
      col_j = A->cols[j] + A->s_mu - A->mu;
      for (i=0; i<colSize; i++)
        col_j[i] = ZERO;
    }

    break;

  }

}